

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

iterator * __thiscall
idx2::Lookup<unsigned_long,idx2::chunk_exp_info>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht,unsigned_long *Key)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)((long)Ht->Keys * -0x61c8864680b583eb) >> (-(char)this[0x20] & 0x3fU);
  uVar3 = ~(-1L << ((byte)this[0x20] & 0x3f));
  uVar1 = uVar4;
  do {
    uVar2 = uVar1;
    if (*(char *)(*(long *)(this + 0x10) + uVar1) == '\0') break;
    if (*(unsigned_long **)(*(long *)this + uVar1 * 8) == Ht->Keys) goto LAB_00178dc6;
    uVar1 = uVar1 + 1 & uVar3;
    uVar2 = uVar4;
  } while (uVar1 != uVar4);
  for (; *(char *)(*(long *)(this + 0x10) + uVar2) == '\x02'; uVar2 = uVar2 + 1 & uVar3) {
  }
LAB_00178dc6:
  __return_storage_ptr__->Key = (unsigned_long *)(*(long *)this + uVar2 * 8);
  __return_storage_ptr__->Val = (chunk_exp_info *)(uVar2 * 0x90 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)this;
  __return_storage_ptr__->Idx = uVar2;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Lookup(const hash_table<k, v>& Ht, const k& Key)
{
  i64 H = Index(Ht, Hash(Key));
  i64 Start = H;
  bool Found = false;
  while (Ht.Stats[H] != hash_table<k, v>::Empty)
  { // either Occupied or Tombstone
    if (Ht.Keys[H] == Key)
    {
      Found = true;
      break;
    }
    ++H;
    if ((H &= Capacity(Ht) - 1) == Start)
      break;
  }
  if (!Found)
  {
    while (Ht.Stats[H] == hash_table<k, v>::Occupied)
    {
      ++H;
      H &= Capacity(Ht) - 1;
    }
  }
  auto Result = IterAt(Ht, H);
  if (Found)
  {
    idx2_Assert(*Result.Key == Key);
  }
  return Result;
}